

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

QByteArray * __thiscall QMetaMethod::parameterTypeName(QMetaMethod *this,int index)

{
  int iVar1;
  int in_EDX;
  QMetaMethod *in_RSI;
  QMetaObject *in_RDI;
  QByteArrayView QVar2;
  QMetaMethod *in_stack_ffffffffffffffa8;
  QMetaObject *pQVar3;
  
  pQVar3 = in_RDI;
  if (((in_RSI->mobj != (QMetaObject *)0x0) && (-1 < in_EDX)) &&
     (iVar1 = parameterCount(in_stack_ffffffffffffffa8), in_EDX < iVar1)) {
    anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::get(in_RSI);
    QVar2 = anon_unknown.dwarf_5d5f2d::QMetaMethodPrivate::parameterTypeName
                      ((QMetaMethodPrivate *)in_RSI,(int)((ulong)pQVar3 >> 0x20));
    QVar2.m_data = (storage_type *)QVar2.m_size;
    QVar2.m_size = (qsizetype)in_RSI;
    stringData(in_RDI,QVar2);
    return (QByteArray *)pQVar3;
  }
  QByteArray::QByteArray((QByteArray *)0x362a50);
  return (QByteArray *)pQVar3;
}

Assistant:

QByteArray QMetaMethod::parameterTypeName(int index) const
{
    if (!mobj || index < 0 || index >= parameterCount())
        return {};
    // ### Qt 7: change the return type and make noexcept
    return stringData(mobj, QMetaMethodPrivate::get(this)->parameterTypeName(index));
}